

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::Swap
          (ExtensionSet *this,MessageLite *extendee,ExtensionSet *other)

{
  bool bVar1;
  undefined1 local_38 [8];
  ExtensionSet extension_set;
  ExtensionSet *other_local;
  MessageLite *extendee_local;
  ExtensionSet *this_local;
  
  extension_set.map_ = (AllocatedData)other;
  bVar1 = CanUseInternalSwap(this->arena_,other->arena_);
  if (bVar1) {
    InternalSwap(this,(ExtensionSet *)extension_set.map_.flat);
  }
  else {
    ExtensionSet((ExtensionSet *)local_38);
    MergeFrom((ExtensionSet *)local_38,extendee,(ExtensionSet *)extension_set.map_.flat);
    Clear((ExtensionSet *)extension_set.map_.flat);
    MergeFrom((ExtensionSet *)extension_set.map_.flat,extendee,this);
    Clear(this);
    MergeFrom(this,extendee,(ExtensionSet *)local_38);
    ~ExtensionSet((ExtensionSet *)local_38);
  }
  return;
}

Assistant:

void ExtensionSet::Swap(const MessageLite* extendee, ExtensionSet* other) {
  if (internal::CanUseInternalSwap(arena_, other->arena_)) {
    InternalSwap(other);
  } else {
    // TODO: We maybe able to optimize a case where we are
    // swapping from heap to arena-allocated extension set, by just Own()'ing
    // the extensions.
    ExtensionSet extension_set;
    extension_set.MergeFrom(extendee, *other);
    other->Clear();
    other->MergeFrom(extendee, *this);
    Clear();
    MergeFrom(extendee, extension_set);
  }
}